

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

string * __thiscall
t_go_generator::module_name_abi_cxx11_
          (string *__return_storage_ptr__,t_go_generator *this,t_type *ttype)

{
  t_go_generator *this_00;
  bool bVar1;
  mapped_type *pmVar2;
  t_program *extraout_RDX;
  t_program *extraout_RDX_00;
  t_program *ptVar3;
  string module;
  allocator local_134;
  allocator local_133;
  allocator local_132;
  allocator local_131;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = (t_go_generator *)ttype->program_;
  if ((this_00 == (t_go_generator *)0x0) ||
     (this_00 == (t_go_generator *)(this->super_t_generator).program_)) {
LAB_001d0df0:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_130);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&local_110,"go",&local_131);
  t_program::get_namespace(&local_130,(t_program *)this_00,&local_110);
  if (local_130._M_string_length != 0) {
    ptVar3 = (this->super_t_generator).program_;
    std::__cxx11::string::string((string *)&local_f0,"go",&local_132);
    t_program::get_namespace(&local_d0,ptVar3,&local_f0);
    if (local_d0._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_90,"go",&local_133);
      t_program::get_namespace(&local_70,(t_program *)this_00,&local_90);
      ptVar3 = (this->super_t_generator).program_;
      std::__cxx11::string::string((string *)&local_b0,"go",&local_134);
      t_program::get_namespace(&local_50,ptVar3,&local_b0);
      bVar1 = std::operator!=(&local_70,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      ptVar3 = extraout_RDX;
      if (!bVar1) goto LAB_001d0df0;
      goto LAB_001d0e2e;
    }
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  ptVar3 = extraout_RDX_00;
LAB_001d0e2e:
  get_real_go_module_abi_cxx11_(&local_130,this_00,ptVar3);
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->package_identifiers_,&local_130);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar2);
  std::__cxx11::string::~string((string *)&local_130);
  return __return_storage_ptr__;
}

Assistant:

string t_go_generator::module_name(t_type* ttype) {
  t_program* program = ttype->get_program();

  if (program != nullptr && program != program_) {
    if (program->get_namespace("go").empty() ||
        program_->get_namespace("go").empty() ||
        program->get_namespace("go") != program_->get_namespace("go")) {
      string module(get_real_go_module(program));
      return package_identifiers_[module];
    }
  }

  return "";
}